

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

void __thiscall
slang::
TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
::~TypedBumpAllocator
          (TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           *this)

{
  Segment *pSVar1;
  Segment *pSVar2;
  byte **ppbVar3;
  Segment *pSVar4;
  
  for (pSVar2 = (this->super_BumpAllocator).head; pSVar2 != (Segment *)0x0; pSVar2 = pSVar2->prev) {
    pSVar1 = (Segment *)pSVar2->current;
    if (pSVar2 + 1 != pSVar1) {
      ppbVar3 = &pSVar2[2].current;
      do {
        if (*ppbVar3 != (byte *)0x0) {
          operator_delete(*ppbVar3,(long)ppbVar3[-2] * 0x100 + 0x100);
          pSVar1 = (Segment *)pSVar2->current;
        }
        pSVar4 = (Segment *)(ppbVar3 + 3);
        ppbVar3 = ppbVar3 + 6;
      } while (pSVar4 != pSVar1);
    }
  }
  BumpAllocator::~BumpAllocator(&this->super_BumpAllocator);
  return;
}

Assistant:

~TypedBumpAllocator() {
        Segment* seg = head;
        while (seg) {
            for (T* cur = (T*)(seg + 1); cur != (T*)seg->current; cur++)
                cur->~T();
            seg = seg->prev;
        }
    }